

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

int Omega_h::step(FiniteAutomaton *fa,int state,int symbol)

{
  int iVar1;
  ConstRef pvVar2;
  char *pcVar3;
  undefined8 uStack_20;
  
  if (state < 0) {
    pcVar3 = "0 <= state";
    uStack_20 = 0x47;
  }
  else {
    iVar1 = get_nrows<int>(&fa->table);
    if (state < iVar1) {
      if (symbol < 0) {
        pcVar3 = "0 <= symbol";
        uStack_20 = 0x49;
      }
      else {
        if (symbol < (fa->table).ncols) {
          pvVar2 = at<int>(&fa->table,state,symbol);
          return *pvVar2;
        }
        pcVar3 = "symbol < get_ncols(fa.table)";
        uStack_20 = 0x4b;
      }
    }
    else {
      pcVar3 = "state < get_nstates(fa)";
      uStack_20 = 0x48;
    }
  }
  fail("assertion %s failed at %s +%d\n",pcVar3,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,uStack_20);
}

Assistant:

int step(FiniteAutomaton const& fa, int state, int symbol) {
  OMEGA_H_CHECK(0 <= state);
  OMEGA_H_CHECK(state < get_nstates(fa));
  OMEGA_H_CHECK(0 <= symbol);
  OMEGA_H_CHECK(
      symbol < get_ncols(fa.table));  // allow getting epsilon transitions
  return at(fa.table, state, symbol);
}